

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O2

int __thiscall amrex::Amr::numGrids(Amr *this)

{
  long *plVar1;
  int iVar2;
  int i;
  long lVar3;
  
  iVar2 = 0;
  for (lVar3 = 0; lVar3 <= *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
      lVar3 = lVar3 + 1) {
    plVar1 = *(long **)((long)(this->amr_level).
                              super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                              .
                              super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar3]._M_t.
                              super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                       + 0x120);
    iVar2 = iVar2 + (int)((plVar1[1] - *plVar1) / 0x1c);
  }
  return iVar2;
}

Assistant:

int
Amr::numGrids () noexcept
{
    int cnt = 0;
    for (int i = 0; i <= finest_level; i++) {
        cnt += amr_level[i]->numGrids();
    }
    return cnt;
}